

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  int *piVar1;
  undefined1 uVar2;
  uint uVar3;
  U32 UVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  undefined4 *puVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  char cVar15;
  ulong uVar16;
  long *plVar17;
  int iVar18;
  BYTE *huffWeight;
  undefined1 uVar19;
  uint uVar20;
  U32 local_80;
  U32 nbSymbols;
  long local_78;
  size_t local_70;
  uint local_64;
  long local_60;
  long local_58;
  HUF_DTable *local_50;
  HUF_DTable *local_48;
  HUF_DTable *local_40;
  ulong local_38;
  
  local_80 = 0;
  nbSymbols = 0;
  local_70 = 0xffffffffffffffd4;
  if (0x5d3 < wkspSize) {
    huffWeight = (BYTE *)((long)workSpace + 0x4d4);
    local_70 = HUF_readStats_wksp(huffWeight,0x100,(U32 *)workSpace,&nbSymbols,&local_80,src,srcSize
                                  ,(void *)((long)workSpace + 0x68),0x36c,flags);
    UVar4 = nbSymbols;
    if (local_70 < 0xffffffffffffff89) {
      uVar3 = *DTable;
      uVar7 = (uVar3 & 0xff) + 1;
      uVar20 = 0xb;
      if (uVar7 < 0xb) {
        uVar20 = uVar7;
      }
      uVar6 = (ulong)nbSymbols;
      if (local_80 < uVar20 || local_80 - uVar20 == 0) {
        if (local_80 < uVar20) {
          uVar7 = uVar20 - local_80;
          if (uVar6 != 0) {
            uVar16 = 0;
            do {
              cVar15 = '\0';
              if (huffWeight[uVar16] != '\0') {
                cVar15 = (char)uVar7;
              }
              huffWeight[uVar16] = cVar15 + huffWeight[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar6 != uVar16);
          }
          if (uVar7 < uVar20) {
            puVar11 = (undefined4 *)((long)workSpace + (ulong)uVar20 * 4);
            uVar13 = uVar20;
            do {
              *puVar11 = *(undefined4 *)
                          ((long)workSpace + (ulong)((local_80 - uVar20) + uVar13) * 4);
              uVar13 = uVar13 - 1;
              puVar11 = puVar11 + -1;
            } while (uVar7 < uVar13);
          }
          memset((void *)((long)workSpace + ((ulong)uVar7 - (ulong)(~local_80 + uVar20)) * 4),0,
                 (ulong)(~local_80 + uVar20) * 4 + 4);
        }
      }
      else {
        uVar20 = local_80;
        if (uVar7 < local_80) {
          return 0xffffffffffffffd4;
        }
      }
      local_80 = uVar20;
      *(char *)DTable = (char)uVar3;
      *(undefined1 *)((long)DTable + 1) = 0;
      *(char *)((long)DTable + 2) = (char)local_80;
      *(char *)((long)DTable + 3) = (char)(uVar3 >> 0x18);
      lVar9 = 0;
      iVar8 = 0;
      do {
        piVar1 = (int *)((long)workSpace + lVar9);
        *(int *)((long)workSpace + lVar9 + 0x34) = iVar8;
        lVar9 = lVar9 + 4;
        iVar8 = *piVar1 + iVar8;
      } while ((ulong)local_80 * 4 + 4 != lVar9);
      uVar16 = 0;
      if (3 < (int)UVar4) {
        uVar16 = 0;
        do {
          uVar10 = uVar16 & 0xffffffff;
          lVar9 = 0;
          do {
            uVar3 = *(uint *)((long)workSpace + (ulong)huffWeight[lVar9] * 4 + 0x34);
            *(uint *)((long)workSpace + (ulong)huffWeight[lVar9] * 4 + 0x34) = uVar3 + 1;
            *(char *)((long)workSpace + (ulong)uVar3 + 0x3d4) = (char)uVar10;
            lVar9 = lVar9 + 1;
            uVar10 = (ulong)(byte)((char)uVar10 + 1);
          } while (lVar9 != 4);
          uVar16 = uVar16 + 4;
          huffWeight = huffWeight + 4;
        } while (uVar16 < UVar4 - 3);
      }
      if ((int)uVar16 < (int)UVar4) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          uVar10 = (ulong)*(byte *)((long)workSpace + uVar16 + 0x4d4);
          uVar3 = *(uint *)((long)workSpace + uVar10 * 4 + 0x34);
          *(uint *)((long)workSpace + uVar10 * 4 + 0x34) = uVar3 + 1;
          *(char *)((long)workSpace + (ulong)uVar3 + 0x3d4) = (char)uVar16;
          uVar16 = uVar16 + 1;
        } while (uVar6 != uVar16);
      }
      local_64 = local_80 + 1;
      if (1 < local_64) {
        iVar8 = *workSpace;
        local_38 = (ulong)local_64;
        local_48 = DTable + 3;
        local_78 = (long)workSpace + 0x3d4;
        local_50 = DTable + 1;
        local_58 = (long)DTable + 7;
        local_60 = (long)DTable + 5;
        local_40 = DTable + 7;
        iVar18 = 0;
        uVar6 = 1;
        do {
          uVar3 = *(uint *)((long)workSpace + uVar6 * 4);
          uVar16 = (ulong)uVar3;
          iVar14 = (1 << ((byte)uVar6 & 0x1f)) >> 1;
          uVar20 = local_64 - (int)uVar6;
          uVar19 = (undefined1)uVar20;
          switch(iVar14) {
          case 1:
            if (0 < (int)uVar3) {
              lVar9 = local_60 + (long)iVar18 * 2;
              uVar10 = 0;
              do {
                uVar2 = *(undefined1 *)(iVar8 + local_78 + uVar10);
                *(undefined1 *)(lVar9 + -1 + uVar10 * 2) = uVar19;
                *(undefined1 *)(lVar9 + uVar10 * 2) = uVar2;
                uVar10 = uVar10 + 1;
              } while (uVar16 != uVar10);
            }
            break;
          case 2:
            if (0 < (int)uVar3) {
              lVar9 = local_58 + (long)iVar18 * 2;
              uVar10 = 0;
              do {
                uVar2 = *(undefined1 *)(iVar8 + local_78 + uVar10);
                *(undefined1 *)(lVar9 + -3 + uVar10 * 4) = uVar19;
                *(undefined1 *)(lVar9 + -2 + uVar10 * 4) = uVar2;
                *(undefined1 *)(lVar9 + -1 + uVar10 * 4) = uVar19;
                *(undefined1 *)(lVar9 + uVar10 * 4) = uVar2;
                uVar10 = uVar10 + 1;
              } while (uVar16 != uVar10);
            }
            break;
          default:
            if (0 < (int)uVar3) {
              lVar9 = (long)local_40 + (long)iVar18 * 2;
              uVar10 = 0;
              do {
                if (iVar14 < 1) {
LAB_00219d4c:
                  __assert_fail("u == length",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                                ,0x1e1,
                                "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                               );
                }
                lVar12 = ((ulong)*(byte *)((long)workSpace + (long)iVar8 + uVar10 + 0x3d4) << 8 |
                         (ulong)(uVar20 & 0xff)) * 0x1000100010001;
                lVar5 = 0;
                do {
                  *(long *)(lVar9 + -0x18 + lVar5 * 2) = lVar12;
                  *(long *)(lVar9 + -0x10 + lVar5 * 2) = lVar12;
                  *(long *)(lVar9 + -8 + lVar5 * 2) = lVar12;
                  *(long *)(lVar9 + lVar5 * 2) = lVar12;
                  lVar5 = lVar5 + 0x10;
                } while (lVar5 < iVar14);
                if (iVar14 != (int)lVar5) goto LAB_00219d4c;
                uVar10 = uVar10 + 1;
                lVar9 = lVar9 + (long)iVar14 * 2;
              } while (uVar10 != uVar16);
            }
            break;
          case 4:
            if (0 < (int)uVar3) {
              uVar10 = 0;
              do {
                *(ulong *)((long)local_50 + uVar10 * 8 + (long)iVar18 * 2) =
                     ((ulong)*(byte *)(iVar8 + local_78 + uVar10) << 8 | (ulong)(uVar20 & 0xff)) *
                     0x1000100010001;
                uVar10 = uVar10 + 1;
              } while (uVar16 != uVar10);
            }
            break;
          case 8:
            if (0 < (int)uVar3) {
              plVar17 = (long *)((long)local_48 + (long)iVar18 * 2);
              uVar10 = 0;
              do {
                lVar9 = ((ulong)*(byte *)(iVar8 + local_78 + uVar10) << 8 | (ulong)(uVar20 & 0xff))
                        * 0x1000100010001;
                plVar17[-1] = lVar9;
                *plVar17 = lVar9;
                uVar10 = uVar10 + 1;
                plVar17 = plVar17 + 2;
              } while (uVar16 != uVar10);
            }
          }
          iVar8 = iVar8 + uVar3;
          iVar18 = iVar18 + iVar14 * uVar3;
          uVar6 = uVar6 + 1;
        } while (uVar6 != local_38);
      }
    }
  }
  return local_70;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}